

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FieldGenerator::SetInlinedStringIndex
          (FieldGenerator *this,int32_t inlined_string_index)

{
  bool bVar1;
  mapped_type *pmVar2;
  LogMessage *other;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  AlphaNum *this_01;
  ulong uVar3;
  Hex hex;
  Hex hex_00;
  AlphaNum *in_stack_fffffffffffffe88;
  allocator local_16d;
  int local_16c;
  AlphaNum local_168;
  string local_138;
  AlphaNum local_118;
  key_type local_e8;
  LogMessage local_c8;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar1 = IsStringInlined(this->descriptor_,this->options_);
  if (bVar1) {
    local_c8._0_8_ = "(_inlined_string_donated_[";
    local_c8.filename_ = (char *)0x1a;
    local_16c = inlined_string_index / 0x20;
    strings::AlphaNum::AlphaNum(&local_90,local_16c);
    local_60.piece_data_ = "] & 0x";
    local_60.piece_size_ = 6;
    uVar3 = (ulong)(uint)(1 << ((byte)inlined_string_index & 0x1f));
    this_01 = &local_118;
    hex._8_8_ = 8;
    hex.value = uVar3;
    strings::AlphaNum::AlphaNum(this_01,hex);
    local_168.piece_data_ = "u) != 0;";
    local_168.piece_size_ = 8;
    StrCat_abi_cxx11_(&local_138,(protobuf *)&local_c8,&local_90,&local_60,this_01,&local_168,
                      in_stack_fffffffffffffe88);
    std::__cxx11::string::string((string *)&local_e8,"inlined_string_donated",&local_16d);
    this_00 = &this->variables_;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_e8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_138);
    local_c8._0_8_ = "_inlined_string_donated_[";
    local_c8.filename_ = (char *)0x19;
    strings::AlphaNum::AlphaNum(&local_90,local_16c);
    local_60.piece_data_ = "]";
    local_60.piece_size_ = 1;
    StrCat_abi_cxx11_((string *)&local_118,(protobuf *)&local_c8,&local_90,&local_60,this_01);
    std::__cxx11::string::string
              ((string *)&local_168,"donating_states_word",(allocator *)&local_138);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&local_168);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_118);
    local_c8._0_8_ = "~0x";
    local_c8.filename_ = (char *)0x3;
    hex_00._8_8_ = 8;
    hex_00.value = uVar3;
    strings::AlphaNum::AlphaNum(&local_90,hex_00);
    local_60.piece_data_ = "u";
    local_60.piece_size_ = 1;
    StrCat_abi_cxx11_((string *)&local_118,(protobuf *)&local_c8,&local_90,&local_60,this_01);
    std::__cxx11::string::string((string *)&local_168,"mask_for_undonate",(allocator *)&local_138);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&local_168);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_118);
  }
  else if (inlined_string_index != -1) {
    internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_field.cc"
               ,0x11f);
    other = internal::LogMessage::operator<<
                      (&local_c8,"CHECK failed: (inlined_string_index) == (-1): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,other);
    internal::LogMessage::~LogMessage(&local_c8);
  }
  return;
}

Assistant:

void FieldGenerator::SetInlinedStringIndex(int32_t inlined_string_index) {
  if (!IsStringInlined(descriptor_, options_)) {
    GOOGLE_CHECK_EQ(inlined_string_index, -1);
    return;
  }
  variables_["inlined_string_donated"] = StrCat(
      "(_inlined_string_donated_[", inlined_string_index / 32, "] & 0x",
      strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8),
      "u) != 0;");
  variables_["donating_states_word"] =
      StrCat("_inlined_string_donated_[", inlined_string_index / 32, "]");
  variables_["mask_for_undonate"] = StrCat(
      "~0x", strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8),
      "u");
}